

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O1

void __thiscall
PSVIWriterHandlers::processAttributes
          (PSVIWriterHandlers *this,PSVIAttributeList *psviAttributes,
          RefVectorOf<AttrInfo> *attributesInfo)

{
  XMLCh *value;
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pRVar1;
  ValueVectorOf<unsigned_long> *this_00;
  XMLSize_t XVar2;
  bool bVar3;
  bool bVar4;
  AttrInfo *pAVar5;
  ulong uVar6;
  long lVar7;
  PSVIAttribute *attrPSVI;
  XMLCh *pXVar8;
  XMLCh *pXVar9;
  RefHashTableBucketElem<char16_t> *pRVar10;
  XMLCh XVar11;
  XMLSize_t getAt;
  
  this->fNSAttributes->fCurCount = 0;
  if ((attributesInfo->super_BaseRefVectorOf<AttrInfo>).fCurCount != 0) {
    bVar3 = true;
    getAt = 0;
    do {
      pAVar5 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt
                         (&attributesInfo->super_BaseRefVectorOf<AttrInfo>,getAt);
      if (pAVar5->uri == (XMLCh *)&xercesc_4_0::XMLUni::fgXMLNSURIName) {
        this_00 = this->fNSAttributes;
        xercesc_4_0::ValueVectorOf<unsigned_long>::ensureExtraCapacity(this_00,1);
        XVar2 = this_00->fCurCount;
        this_00->fCurCount = XVar2 + 1;
        this_00->fElemList[XVar2] = getAt;
      }
      else {
        if (bVar3) {
          writeOpen(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
          incIndent(this);
          bVar3 = false;
        }
        pAVar5 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt
                           (&attributesInfo->super_BaseRefVectorOf<AttrInfo>,getAt);
        value = pAVar5->name;
        pAVar5 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt
                           (&attributesInfo->super_BaseRefVectorOf<AttrInfo>,getAt);
        pXVar9 = pAVar5->uri;
        writeOpen(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
        incIndent(this);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceName,pXVar9);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgLocalName,value);
        pRVar1 = this->fPrefixMap;
        pAVar5 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt
                           (&attributesInfo->super_BaseRefVectorOf<AttrInfo>,getAt);
        pXVar9 = pAVar5->uri;
        if ((pXVar9 == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*pXVar9, uVar6 == 0)) {
          uVar6 = 0;
        }
        else {
          XVar11 = pXVar9[1];
          if (XVar11 != L'\0') {
            pXVar8 = pXVar9 + 2;
            do {
              uVar6 = (ulong)(ushort)XVar11 + (uVar6 >> 0x18) + uVar6 * 0x26;
              XVar11 = *pXVar8;
              pXVar8 = pXVar8 + 1;
            } while (XVar11 != L'\0');
          }
          uVar6 = uVar6 % pRVar1->fHashModulus;
        }
        pRVar10 = pRVar1->fBucketList[uVar6];
        if (pRVar10 != (RefHashTableBucketElem<char16_t> *)0x0) {
          do {
            bVar4 = xercesc_4_0::StringHasher::equals
                              ((StringHasher *)&pRVar1->field_0x30,pXVar9,pRVar10->fKey);
            if (bVar4) goto LAB_00110132;
            pRVar10 = pRVar10->fNext;
          } while (pRVar10 != (RefHashTableBucketElem<char16_t> *)0x0);
        }
        pRVar10 = (RefHashTableBucketElem<char16_t> *)0x0;
LAB_00110132:
        if (pRVar10 == (RefHashTableBucketElem<char16_t> *)0x0) {
          pXVar9 = (XMLCh *)0x0;
        }
        else {
          pXVar9 = pRVar10->fData;
        }
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgPrefix,pXVar9);
        pAVar5 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt
                           (&attributesInfo->super_BaseRefVectorOf<AttrInfo>,getAt);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNormalizedValue,pAVar5->value);
        pXVar9 = (XMLCh *)&xercesc_4_0::PSVIUni::fgUnknown;
        if (psviAttributes != (PSVIAttributeList *)0x0) {
          lVar7 = xercesc_4_0::PSVIAttributeList::getAttributePSVIAtIndex((ulong)psviAttributes);
          pXVar9 = (XMLCh *)&xercesc_4_0::PSVIUni::fgUnknown;
          if (lVar7 != 0) {
            lVar7 = xercesc_4_0::PSVIAttributeList::getAttributePSVIAtIndex((ulong)psviAttributes);
            pXVar9 = (XMLCh *)&xercesc_4_0::PSVIUni::fgTrue;
            if (*(char *)(lVar7 + 0x38) != '\0') {
              pXVar9 = (XMLCh *)&xercesc_4_0::PSVIUni::fgFalse;
            }
          }
        }
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSpecified,pXVar9);
        pAVar5 = xercesc_4_0::BaseRefVectorOf<AttrInfo>::elementAt
                           (&attributesInfo->super_BaseRefVectorOf<AttrInfo>,getAt);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributeType,pAVar5->type);
        sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgReferences);
        attrPSVI = (PSVIAttribute *)
                   xercesc_4_0::PSVIAttributeList::getAttributePSVIByName
                             ((wchar16 *)psviAttributes,value);
        processAttributePSVI(this,attrPSVI);
        sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
      }
      getAt = getAt + 1;
    } while (getAt < (attributesInfo->super_BaseRefVectorOf<AttrInfo>).fCurCount);
    if (!bVar3) {
      sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
      goto LAB_00110252;
    }
  }
  writeEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
LAB_00110252:
  processNamespaceAttributes(this,psviAttributes,attributesInfo);
  return;
}

Assistant:

void PSVIWriterHandlers::processAttributes(PSVIAttributeList* psviAttributes, const RefVectorOf<AttrInfo>* attributesInfo) {
	fNSAttributes->removeAllElements();  //will store the indecies of namespace attributes
	bool firstFlag = true;
	for (XMLSize_t i = 0; i < attributesInfo->size(); i++) {
		if (attributesInfo->elementAt(i)->getUri() == XMLUni::fgXMLNSURIName) {
			fNSAttributes->addElement(i);
		} else {
			if (firstFlag) {
				sendIndentedElement(PSVIUni::fgAttributes);
				firstFlag = false;
			}
			const XMLCh* localName = attributesInfo->elementAt(i)->getLocalName();
			const XMLCh* namespaceUri = attributesInfo->elementAt(i)->getUri();
			sendIndentedElement(PSVIUni::fgAttribute);
			sendElementValue(PSVIUni::fgNamespaceName, namespaceUri);
			sendElementValue(PSVIUni::fgLocalName, localName);
			sendElementValue(PSVIUni::fgPrefix, fPrefixMap->get(attributesInfo->elementAt(i)->getUri()));
			sendElementValue(PSVIUni::fgNormalizedValue, attributesInfo->elementAt(i)->getValue());
			if (psviAttributes!=NULL && psviAttributes->getAttributePSVIAtIndex(i)!=NULL) {
				sendElementValue(PSVIUni::fgSpecified,
					translateBool(!(psviAttributes->getAttributePSVIAtIndex(i)->getIsSchemaSpecified())));
			} else //the desired value is !schemaSpecified
				sendElementValue(PSVIUni::fgSpecified, PSVIUni::fgUnknown);
			sendElementValue(PSVIUni::fgAttributeType, attributesInfo->elementAt(i)->getType());
			sendElementEmpty(PSVIUni::fgReferences);
			PSVIAttribute* psviAttr = psviAttributes->getAttributePSVIByName(localName, namespaceUri);
			processAttributePSVI(psviAttr);
			sendUnindentedElement(PSVIUni::fgAttribute);
		}
	}
	if (firstFlag)
		writeEmpty(PSVIUni::fgAttributes);
	else
		sendUnindentedElement(PSVIUni::fgAttributes);
	processNamespaceAttributes(psviAttributes, attributesInfo);
}